

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::constant_expression_vector_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,uint32_t vector)

{
  ConstantVector *pCVar1;
  short sVar2;
  uint32_t uVar3;
  uint uVar4;
  char cVar5;
  uint uVar6;
  SPIRType *pSVar7;
  long *plVar8;
  runtime_error *prVar9;
  undefined **ppuVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  char cVar17;
  byte bVar18;
  uint uVar19;
  ulong uVar20;
  ushort uVar21;
  SPIRConstant *pSVar22;
  bool bVar23;
  string __str;
  string int64_type;
  SPIRType scalar_type;
  SPIRType type;
  undefined1 local_478 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  uint *local_458;
  size_t local_450;
  uint local_440 [8];
  bool *local_420;
  size_t local_418;
  bool local_408 [24];
  TypedID<(spirv_cross::Types)1> *local_3f0;
  size_t local_3e8;
  TypedID<(spirv_cross::Types)1> local_3d8 [8];
  uint *local_3b8;
  size_t local_3b0;
  uint local_3a0 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_360;
  ConstantVector *local_328;
  string local_320;
  string local_300;
  SPIRConstant *local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  undefined1 local_2d0 [192];
  uint *local_210;
  size_t local_208;
  uint local_1f8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1b8;
  undefined1 local_180 [192];
  uint *local_c0;
  size_t local_b8;
  uint local_a8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  pSVar7 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(c->super_IVariant).field_0xc);
  SPIRType::SPIRType((SPIRType *)local_180,pSVar7);
  local_180._24_4_ = 1;
  SPIRType::SPIRType((SPIRType *)local_2d0,(SPIRType *)local_180);
  local_2d0._20_4_ = 1;
  local_2d8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_2d8;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar23 = 1 < (c->m).c[0].vecsize;
  bVar18 = (this->backend).use_constructor_splatting & bVar23;
  bVar14 = bVar23 & (this->backend).can_swizzle_scalar & local_180._12_4_ - 0xc < 3;
  if (((bVar18 != 0) || (bVar14 != 0)) && (uVar3 = (c->m).c[0].vecsize, uVar3 != 0)) {
    lVar12 = 0;
    do {
      if ((c->m).c[vector].id[lVar12].id != 0) {
        bVar18 = 0;
        bVar14 = 0;
        break;
      }
      lVar12 = lVar12 + 1;
    } while (uVar3 != (uint32_t)lVar12);
  }
  if ((bVar18 != 0) || (bVar14 != 0)) {
    pCVar1 = (c->m).c + vector;
    uVar15 = (c->m).c[0].vecsize;
    if (local_180._16_4_ == 0x40) {
      if (1 < uVar15) {
        lVar12 = 0;
        do {
          if (pCVar1->r[0].u64 != (c->m).c[vector].r[lVar12 + 1].u64) {
            bVar18 = 0;
            bVar14 = 0;
            break;
          }
          lVar12 = lVar12 + 1;
        } while (uVar15 - 1 != (int)lVar12);
      }
    }
    else if (1 < uVar15) {
      lVar12 = 0;
      do {
        if (pCVar1->r[0].u32 != (c->m).c[vector].r[lVar12 + 1].u32) {
          bVar18 = 0;
          bVar14 = 0;
        }
        lVar12 = lVar12 + 1;
      } while ((ulong)uVar15 - 1 != lVar12);
    }
  }
  if ((1 < (c->m).c[0].vecsize) && (bVar14 == 0)) {
    (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_300,this,local_180,0);
    plVar8 = (long *)::std::__cxx11::string::append((char *)&local_300);
    ppuVar10 = (undefined **)(plVar8 + 2);
    if ((undefined **)*plVar8 == ppuVar10) {
      local_468._M_allocated_capacity._0_4_ = SUB84(*ppuVar10,0);
      local_468._M_allocated_capacity._4_4_ = (undefined4)((ulong)*ppuVar10 >> 0x20);
      local_468._8_4_ = (undefined4)plVar8[3];
      local_468._12_4_ = (undefined4)((ulong)plVar8[3] >> 0x20);
      local_478._0_8_ = local_478 + 0x10;
    }
    else {
      local_468._M_allocated_capacity._0_4_ = SUB84(*ppuVar10,0);
      local_468._M_allocated_capacity._4_4_ = (undefined4)((ulong)*ppuVar10 >> 0x20);
      local_478._0_8_ = (undefined **)*plVar8;
    }
    local_478._8_8_ = plVar8[1];
    *plVar8 = (long)ppuVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
    if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
      operator_delete((void *)local_478._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p);
    }
  }
  pSVar22 = c;
  switch(local_180._12_4_) {
  case 2:
    if (bVar18 == 0) {
      uVar15 = (c->m).c[0].vecsize;
      uVar13 = (ulong)uVar15;
      if (uVar15 != 0) {
        uVar20 = 0;
        do {
          if (((uint)uVar13 < 2) || (uVar3 = (c->m).c[vector].id[uVar20].id, uVar3 == 0)) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          else {
            to_expression_abi_cxx11_((string *)local_478,this,uVar3,true);
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_);
            }
          }
          uVar20 = uVar20 + 1;
          if (uVar20 < (c->m).c[0].vecsize) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          uVar13 = (ulong)(c->m).c[0].vecsize;
        } while (uVar20 < uVar13);
      }
      goto LAB_001ed93d;
    }
    goto LAB_001ed935;
  case 3:
    if (bVar18 == 0) {
      uVar15 = (c->m).c[0].vecsize;
      uVar13 = (ulong)uVar15;
      if (uVar15 != 0) {
        uVar20 = 0;
        do {
          if (((uint)uVar13 < 2) || (uVar3 = (c->m).c[vector].id[uVar20].id, uVar3 == 0)) {
            (*(this->super_Compiler)._vptr_Compiler[0x13])(local_478,this,local_2d0,0);
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_);
            }
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            cVar17 = *(char *)((c->m).c[vector].r + uVar20);
            uVar16 = (uint)cVar17;
            uVar15 = -uVar16;
            if (0 < (int)uVar16) {
              uVar15 = uVar16;
            }
            uVar19 = 3 - (uVar15 < 100);
            if (uVar15 < 10) {
              uVar19 = 1;
            }
            local_478._0_8_ = local_478 + 0x10;
            ::std::__cxx11::string::_M_construct((ulong)local_478,(char)uVar19 - (cVar17 >> 7));
            ::std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)(local_478._0_8_ + (ulong)(uVar16 >> 0x1f)),uVar19,uVar15);
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_);
            }
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          else {
            to_expression_abi_cxx11_((string *)local_478,this,uVar3,true);
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_);
            }
          }
          uVar20 = uVar20 + 1;
          if (uVar20 < (c->m).c[0].vecsize) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          uVar13 = (ulong)(c->m).c[0].vecsize;
        } while (uVar20 < uVar13);
      }
      goto LAB_001ed93d;
    }
    cVar17 = *(char *)(c->m).c[vector].r;
    uVar16 = (uint)cVar17;
    uVar15 = -uVar16;
    if (0 < (int)uVar16) {
      uVar15 = uVar16;
    }
    uVar19 = 1;
    if (9 < uVar15) {
      uVar19 = 3 - (uVar15 < 100);
    }
    local_478._0_8_ = local_478 + 0x10;
    ::std::__cxx11::string::_M_construct((ulong)local_478,(char)uVar19 - (cVar17 >> 7));
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)(local_478._0_8_ + (ulong)(uVar16 >> 0x1f)),uVar19,uVar15);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
    goto LAB_001ec518;
  case 4:
    if (bVar18 == 0) {
      uVar15 = (c->m).c[0].vecsize;
      uVar13 = (ulong)uVar15;
      if (uVar15 != 0) {
        uVar20 = 0;
        do {
          if (((uint)uVar13 < 2) || (uVar3 = (c->m).c[vector].id[uVar20].id, uVar3 == 0)) {
            (*(this->super_Compiler)._vptr_Compiler[0x13])(local_478,this,local_2d0,0);
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_);
            }
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            uVar15 = (c->m).c[vector].r[uVar20].u32;
            bVar18 = (byte)uVar15;
            uVar16 = 3 - (bVar18 < 100);
            if (bVar18 < 10) {
              uVar16 = 1;
            }
            local_478._0_8_ = local_478 + 0x10;
            ::std::__cxx11::string::_M_construct((ulong)local_478,(char)uVar16);
            ::std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_478._0_8_,uVar16,uVar15 & 0xff);
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_);
            }
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          else {
            to_expression_abi_cxx11_((string *)local_478,this,uVar3,true);
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_);
            }
          }
          uVar20 = uVar20 + 1;
          if (uVar20 < (c->m).c[0].vecsize) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          uVar13 = (ulong)(c->m).c[0].vecsize;
        } while (uVar20 < uVar13);
      }
      goto LAB_001ed93d;
    }
    uVar15 = (c->m).c[vector].r[0].u32;
    bVar18 = (byte)uVar15;
    uVar16 = 1;
    if (9 < bVar18) {
      uVar16 = 3 - (bVar18 < 100);
    }
    local_478._0_8_ = local_478 + 0x10;
    ::std::__cxx11::string::_M_construct((ulong)local_478,(char)uVar16);
    ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_478._0_8_,uVar16,uVar15 & 0xff);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
    goto LAB_001ec518;
  case 5:
    if (bVar18 == 0) {
      uVar15 = (c->m).c[0].vecsize;
      uVar13 = (ulong)uVar15;
      if (uVar15 != 0) {
        uVar20 = 0;
        do {
          if (((uint)uVar13 < 2) || (uVar3 = (c->m).c[vector].id[uVar20].id, uVar3 == 0)) {
            if (*(this->backend).int16_t_literal_suffix == '\0') {
              (*(this->super_Compiler)._vptr_Compiler[0x13])(local_478,this,local_2d0,0);
              ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
              if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
                operator_delete((void *)local_478._0_8_);
              }
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              sVar2 = *(short *)((c->m).c[vector].r + uVar20);
              uVar16 = (uint)sVar2;
              uVar15 = -uVar16;
              if (0 < (int)uVar16) {
                uVar15 = uVar16;
              }
              uVar19 = 1;
              if (((9 < uVar15) && (uVar19 = 2, 99 < uVar15)) && (uVar19 = 3, 999 < uVar15)) {
                uVar19 = 5 - (uVar15 < 10000);
              }
              local_478._0_8_ = local_478 + 0x10;
              ::std::__cxx11::string::_M_construct
                        ((ulong)local_478,(char)uVar19 - (char)(sVar2 >> 7));
              ::std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)(local_478._0_8_ + (ulong)(uVar16 >> 0x1f)),uVar19,uVar15);
              ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
              if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
                operator_delete((void *)local_478._0_8_);
              }
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
            else {
              sVar2 = *(short *)((c->m).c[vector].r + uVar20);
              uVar16 = (uint)sVar2;
              uVar15 = -uVar16;
              if (0 < (int)uVar16) {
                uVar15 = uVar16;
              }
              uVar19 = 1;
              if (((9 < uVar15) && (uVar19 = 2, 99 < uVar15)) && (uVar19 = 3, 999 < uVar15)) {
                uVar19 = 5 - (uVar15 < 10000);
              }
              local_478._0_8_ = local_478 + 0x10;
              ::std::__cxx11::string::_M_construct
                        ((ulong)local_478,(char)uVar19 - (char)(sVar2 >> 7));
              ::std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)(local_478._0_8_ + (ulong)(uVar16 >> 0x1f)),uVar19,uVar15);
              ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
              if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
                operator_delete((void *)local_478._0_8_);
              }
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
          }
          else {
            to_expression_abi_cxx11_((string *)local_478,this,uVar3,true);
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_);
            }
          }
          uVar20 = uVar20 + 1;
          if (uVar20 < (c->m).c[0].vecsize) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          uVar13 = (ulong)(c->m).c[0].vecsize;
        } while (uVar20 < uVar13);
      }
      goto LAB_001ed93d;
    }
    sVar2 = *(short *)(c->m).c[vector].r;
    uVar16 = (uint)sVar2;
    uVar15 = -uVar16;
    if (0 < (int)uVar16) {
      uVar15 = uVar16;
    }
    uVar19 = 1;
    if (((9 < uVar15) && (uVar19 = 2, 99 < uVar15)) && (uVar19 = 3, 999 < uVar15)) {
      uVar19 = 5 - (uVar15 < 10000);
    }
    local_478._0_8_ = local_478 + 0x10;
    ::std::__cxx11::string::_M_construct((ulong)local_478,(char)uVar19 - (char)(sVar2 >> 7));
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)(local_478._0_8_ + (ulong)(uVar16 >> 0x1f)),uVar19,uVar15);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
    if ((undefined1 *)local_478._0_8_ == local_478 + 0x10) goto LAB_001ed93d;
    break;
  case 6:
    if (bVar18 == 0) {
      uVar15 = (c->m).c[0].vecsize;
      uVar13 = (ulong)uVar15;
      if (uVar15 != 0) {
        uVar20 = 0;
        do {
          if (((uint)uVar13 < 2) || (uVar3 = (c->m).c[vector].id[uVar20].id, uVar3 == 0)) {
            if (*(this->backend).uint16_t_literal_suffix == '\0') {
              (*(this->super_Compiler)._vptr_Compiler[0x13])(local_478,this,local_2d0,0);
              ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
              if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
                operator_delete((void *)local_478._0_8_);
              }
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              uVar15 = (c->m).c[vector].r[uVar20].u32;
              uVar19 = uVar15 & 0xffff;
              uVar16 = 1;
              uVar21 = (ushort)uVar15;
              if (((9 < uVar21) && (uVar16 = 2, 99 < uVar21)) && (uVar16 = 3, 999 < uVar19)) {
                uVar16 = 5 - (uVar19 < 10000);
              }
              local_478._0_8_ = local_478 + 0x10;
              ::std::__cxx11::string::_M_construct((ulong)local_478,(char)uVar16);
              ::std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)local_478._0_8_,uVar16,uVar19);
              ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
              if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
                operator_delete((void *)local_478._0_8_);
              }
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
            else {
              uVar15 = (c->m).c[vector].r[uVar20].u32;
              uVar19 = uVar15 & 0xffff;
              uVar16 = 1;
              uVar21 = (ushort)uVar15;
              if (((9 < uVar21) && (uVar16 = 2, 99 < uVar21)) && (uVar16 = 3, 999 < uVar19)) {
                uVar16 = 5 - (uVar19 < 10000);
              }
              local_478._0_8_ = local_478 + 0x10;
              ::std::__cxx11::string::_M_construct((ulong)local_478,(char)uVar16);
              ::std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)local_478._0_8_,uVar16,uVar19);
              ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
              if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
                operator_delete((void *)local_478._0_8_);
              }
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
          }
          else {
            to_expression_abi_cxx11_((string *)local_478,this,uVar3,true);
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_);
            }
          }
          uVar20 = uVar20 + 1;
          if (uVar20 < (c->m).c[0].vecsize) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          uVar13 = (ulong)(c->m).c[0].vecsize;
        } while (uVar20 < uVar13);
      }
      goto LAB_001ed93d;
    }
    uVar15 = (c->m).c[vector].r[0].u32;
    cVar17 = '\x01';
    if (9 < uVar15) {
      uVar16 = uVar15;
      cVar5 = '\x04';
      do {
        cVar17 = cVar5;
        if (uVar16 < 100) {
          cVar17 = cVar17 + -2;
          goto LAB_001eda9b;
        }
        if (uVar16 < 1000) {
          cVar17 = cVar17 + -1;
          goto LAB_001eda9b;
        }
        if (uVar16 < 10000) goto LAB_001eda9b;
        bVar23 = 99999 < uVar16;
        uVar16 = uVar16 / 10000;
        cVar5 = cVar17 + '\x04';
      } while (bVar23);
      cVar17 = cVar17 + '\x01';
    }
LAB_001eda9b:
    local_478._0_8_ = local_478 + 0x10;
    ::std::__cxx11::string::_M_construct((ulong)local_478,cVar17);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)local_478._0_8_,local_478._8_4_,uVar15);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
    if ((undefined1 *)local_478._0_8_ == local_478 + 0x10) goto LAB_001ed93d;
    break;
  case 7:
    if (bVar18 == 0) {
      uVar15 = (c->m).c[0].vecsize;
      uVar13 = (ulong)uVar15;
      if (uVar15 != 0) {
        ppuVar10 = (undefined **)(local_478 + 0x10);
        uVar20 = 0;
        local_328 = (c->m).c + vector;
        local_2e0 = c;
        do {
          if (((uint)uVar13 < 2) || (uVar3 = local_328->id[uVar20].id, uVar3 == 0)) {
            uVar15 = (c->m).c[vector].r[uVar20].u32;
            local_478._0_8_ = ppuVar10;
            if (uVar15 == 0x80000000) {
              local_468._8_4_ = 0x30303030;
              local_468._M_allocated_capacity._0_4_ = 0x28746e69;
              local_468._M_allocated_capacity._4_4_ = 0x30387830;
              local_478._8_8_ = 0xf;
              local_468._12_4_ = 0x293030;
            }
            else {
              uVar16 = -uVar15;
              if (0 < (int)uVar15) {
                uVar16 = uVar15;
              }
              uVar19 = 1;
              if (9 < uVar16) {
                uVar13 = (ulong)uVar16;
                uVar4 = 4;
                do {
                  uVar19 = uVar4;
                  uVar6 = (uint)uVar13;
                  if (uVar6 < 100) {
                    uVar19 = uVar19 - 2;
                    goto LAB_001ece62;
                  }
                  if (uVar6 < 1000) {
                    uVar19 = uVar19 - 1;
                    goto LAB_001ece62;
                  }
                  if (uVar6 < 10000) goto LAB_001ece62;
                  uVar13 = uVar13 / 10000;
                  uVar4 = uVar19 + 4;
                } while (99999 < uVar6);
                uVar19 = uVar19 + 1;
              }
LAB_001ece62:
              ::std::__cxx11::string::_M_construct
                        ((ulong)local_478,(char)uVar19 - (char)((int)uVar15 >> 0x1f));
              ::std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)(local_478._0_8_ + (ulong)(uVar15 >> 0x1f)),uVar19,uVar16);
              pSVar22 = local_2e0;
            }
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
          }
          else {
            to_expression_abi_cxx11_((string *)local_478,this,uVar3,true);
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
          }
          if ((undefined **)local_478._0_8_ != ppuVar10) {
            operator_delete((void *)local_478._0_8_);
          }
          uVar20 = uVar20 + 1;
          if (uVar20 < (pSVar22->m).c[0].vecsize) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          uVar13 = (ulong)(pSVar22->m).c[0].vecsize;
        } while (uVar20 < uVar13);
      }
      goto LAB_001ed93d;
    }
    uVar15 = (c->m).c[vector].r[0].u32;
    if (uVar15 == 0x80000000) {
      local_478._0_8_ = local_478 + 0x10;
      local_468._M_allocated_capacity._0_4_ = 0x28746e69;
      local_468._M_allocated_capacity._4_4_ = 0x30387830;
      local_468._8_4_ = 0x30303030;
      local_478._8_8_ = 0xf;
      local_468._12_4_ = 0x293030;
    }
    else {
      uVar16 = -uVar15;
      if (0 < (int)uVar15) {
        uVar16 = uVar15;
      }
      uVar19 = 1;
      if (9 < uVar16) {
        uVar13 = (ulong)uVar16;
        uVar4 = 4;
        do {
          uVar19 = uVar4;
          uVar6 = (uint)uVar13;
          if (uVar6 < 100) {
            uVar19 = uVar19 - 2;
            goto LAB_001edbec;
          }
          if (uVar6 < 1000) {
            uVar19 = uVar19 - 1;
            goto LAB_001edbec;
          }
          if (uVar6 < 10000) goto LAB_001edbec;
          uVar13 = uVar13 / 10000;
          uVar4 = uVar19 + 4;
        } while (99999 < uVar6);
        uVar19 = uVar19 + 1;
      }
LAB_001edbec:
      local_478._0_8_ = local_478 + 0x10;
      ::std::__cxx11::string::_M_construct
                ((ulong)local_478,(char)uVar19 - (char)((int)uVar15 >> 0x1f));
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)(local_478._0_8_ + (ulong)(uVar15 >> 0x1f)),uVar19,uVar16);
    }
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
    if ((undefined1 *)local_478._0_8_ == local_478 + 0x10) goto LAB_001ed93d;
    break;
  case 8:
    if (bVar18 == 0) {
      uVar15 = (c->m).c[0].vecsize;
      uVar13 = (ulong)uVar15;
      if (uVar15 != 0) {
        uVar20 = 0;
        do {
          if (((uint)uVar13 < 2) || (uVar3 = (c->m).c[vector].id[uVar20].id, uVar3 == 0)) {
            uVar15 = (c->m).c[vector].r[uVar20].u32;
            cVar17 = '\x01';
            if (9 < uVar15) {
              uVar16 = uVar15;
              cVar5 = '\x04';
              do {
                cVar17 = cVar5;
                if (uVar16 < 100) {
                  cVar17 = cVar17 + -2;
                  goto LAB_001ed3b8;
                }
                if (uVar16 < 1000) {
                  cVar17 = cVar17 + -1;
                  goto LAB_001ed3b8;
                }
                if (uVar16 < 10000) goto LAB_001ed3b8;
                bVar23 = 99999 < uVar16;
                uVar16 = uVar16 / 10000;
                cVar5 = cVar17 + '\x04';
              } while (bVar23);
              cVar17 = cVar17 + '\x01';
            }
LAB_001ed3b8:
            local_478._0_8_ = local_478 + 0x10;
            ::std::__cxx11::string::_M_construct((ulong)local_478,cVar17);
            ::std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_478._0_8_,local_478._8_4_,uVar15);
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_);
            }
            uVar15 = 0x81;
            if ((this->options).es != false) {
              uVar15 = 299;
            }
            if (uVar15 < (this->options).version) {
              if ((this->backend).uint32_t_literal_suffix == true) {
                ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              }
            }
            else if ((c->m).c[vector].r[uVar20].i32 < 0) {
              prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_478._0_8_ = local_478 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_478,
                         "Tried to convert uint literal into int, but this made the literal negative."
                         ,"");
              ::std::runtime_error::runtime_error(prVar9,(string *)local_478);
              *(undefined ***)prVar9 = &PTR__runtime_error_003d7e38;
              __cxa_throw(prVar9,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
          }
          else {
            to_expression_abi_cxx11_((string *)local_478,this,uVar3,true);
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
            if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
              operator_delete((void *)local_478._0_8_);
            }
          }
          uVar20 = uVar20 + 1;
          if (uVar20 < (c->m).c[0].vecsize) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          uVar13 = (ulong)(c->m).c[0].vecsize;
        } while (uVar20 < uVar13);
      }
      goto LAB_001ed93d;
    }
    uVar15 = (c->m).c[vector].r[0].u32;
    cVar17 = '\x01';
    if (9 < uVar15) {
      uVar16 = uVar15;
      cVar5 = '\x04';
      do {
        cVar17 = cVar5;
        if (uVar16 < 100) {
          cVar17 = cVar17 + -2;
          goto LAB_001edae9;
        }
        if (uVar16 < 1000) {
          cVar17 = cVar17 + -1;
          goto LAB_001edae9;
        }
        if (uVar16 < 10000) goto LAB_001edae9;
        bVar23 = 99999 < uVar16;
        uVar16 = uVar16 / 10000;
        cVar5 = cVar17 + '\x04';
      } while (bVar23);
      cVar17 = cVar17 + '\x01';
    }
LAB_001edae9:
    ppuVar10 = (undefined **)(local_478 + 0x10);
    local_478._0_8_ = ppuVar10;
    ::std::__cxx11::string::_M_construct((ulong)local_478,cVar17);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)local_478._0_8_,local_478._8_4_,uVar15);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
    if ((undefined **)local_478._0_8_ != ppuVar10) {
      operator_delete((void *)local_478._0_8_);
    }
    uVar15 = 0x81;
    if ((this->options).es != false) {
      uVar15 = 299;
    }
    if ((this->options).version <= uVar15) {
      if ((c->m).c[vector].r[0].i32 < 0) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_478._0_8_ = ppuVar10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_478,
                   "Tried to convert uint literal into int, but this made the literal negative.","")
        ;
        ::std::runtime_error::runtime_error(prVar9,(string *)local_478);
        *(undefined ***)prVar9 = &PTR__runtime_error_003d7e38;
        __cxa_throw(prVar9,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      goto LAB_001ed93d;
    }
    if ((this->backend).uint32_t_literal_suffix == false) goto LAB_001ed93d;
    goto LAB_001ed935;
  case 9:
    SPIRType::SPIRType((SPIRType *)local_478,(SPIRType *)local_180);
    local_468._M_allocated_capacity._4_4_ = 1;
    local_468._8_4_ = 1;
    (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_300,this,local_478,0);
    if (bVar18 == 0) {
      uVar15 = (c->m).c[0].vecsize;
      uVar13 = (ulong)uVar15;
      if (uVar15 != 0) {
        uVar20 = 0;
        do {
          if (((uint)uVar13 < 2) || (uVar3 = (c->m).c[vector].id[uVar20].id, uVar3 == 0)) {
            convert_to_string(&local_320,(c->m).c[vector].r[uVar20].i64,&local_300,
                              (this->backend).long_long_literal_suffix);
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_320._M_dataplus._M_p);
          }
          else {
            to_expression_abi_cxx11_(&local_320,this,uVar3,true);
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_320._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._M_dataplus._M_p != &local_320.field_2) {
            operator_delete(local_320._M_dataplus._M_p);
          }
          uVar20 = uVar20 + 1;
          if (uVar20 < (c->m).c[0].vecsize) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          uVar13 = (ulong)(c->m).c[0].vecsize;
        } while (uVar20 < uVar13);
      }
    }
    else {
      convert_to_string(&local_320,(c->m).c[vector].r[0].i64,&local_300,
                        (this->backend).long_long_literal_suffix);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_320._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p);
    }
    local_478._0_8_ = &PTR__SPIRType_003d8230;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_360);
    local_3b0 = 0;
    if (local_3b8 != local_3a0) {
      free(local_3b8);
    }
    local_3e8 = 0;
    if (local_3f0 != local_3d8) {
      free(local_3f0);
    }
    local_418 = 0;
    if (local_420 != local_408) {
      free(local_420);
    }
    local_450 = 0;
    if (local_458 != local_440) {
      free(local_458);
    }
    goto LAB_001ed93d;
  case 10:
    if (bVar18 == 0) {
      uVar15 = (c->m).c[0].vecsize;
      uVar13 = (ulong)uVar15;
      if (uVar15 != 0) {
        ppuVar10 = (undefined **)(local_478 + 0x10);
        uVar20 = 0;
        local_328 = (c->m).c + vector;
        do {
          if (((uint)uVar13 < 2) || (uVar3 = local_328->id[uVar20].id, uVar3 == 0)) {
            uVar13 = (c->m).c[vector].r[uVar20].u64;
            cVar17 = '\x01';
            if (9 < uVar13) {
              uVar11 = uVar13;
              cVar5 = '\x04';
              do {
                cVar17 = cVar5;
                if (uVar11 < 100) {
                  cVar17 = cVar17 + -2;
                  goto LAB_001ec7e9;
                }
                if (uVar11 < 1000) {
                  cVar17 = cVar17 + -1;
                  goto LAB_001ec7e9;
                }
                if (uVar11 < 10000) goto LAB_001ec7e9;
                bVar23 = 99999 < uVar11;
                uVar11 = uVar11 / 10000;
                cVar5 = cVar17 + '\x04';
              } while (bVar23);
              cVar17 = cVar17 + '\x01';
            }
LAB_001ec7e9:
            local_478._0_8_ = ppuVar10;
            ::std::__cxx11::string::_M_construct((ulong)local_478,cVar17);
            ::std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_478._0_8_,local_478._8_4_,uVar13);
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
            if ((undefined **)local_478._0_8_ != ppuVar10) {
              operator_delete((void *)local_478._0_8_);
            }
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          else {
            to_expression_abi_cxx11_((string *)local_478,this,uVar3,true);
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
            if ((undefined **)local_478._0_8_ != ppuVar10) {
              operator_delete((void *)local_478._0_8_);
            }
          }
          uVar20 = uVar20 + 1;
          if (uVar20 < (c->m).c[0].vecsize) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          uVar13 = (ulong)(c->m).c[0].vecsize;
        } while (uVar20 < uVar13);
      }
      goto LAB_001ed93d;
    }
    uVar13 = (c->m).c[vector].r[0].u64;
    cVar17 = '\x01';
    if (9 < uVar13) {
      uVar20 = uVar13;
      cVar5 = '\x04';
      do {
        cVar17 = cVar5;
        if (uVar20 < 100) {
          cVar17 = cVar17 + -2;
          goto LAB_001ed8d3;
        }
        if (uVar20 < 1000) {
          cVar17 = cVar17 + -1;
          goto LAB_001ed8d3;
        }
        if (uVar20 < 10000) goto LAB_001ed8d3;
        bVar23 = 99999 < uVar20;
        uVar20 = uVar20 / 10000;
        cVar5 = cVar17 + '\x04';
      } while (bVar23);
      cVar17 = cVar17 + '\x01';
    }
LAB_001ed8d3:
    local_478._0_8_ = local_478 + 0x10;
    ::std::__cxx11::string::_M_construct((ulong)local_478,cVar17);
    ::std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_478._0_8_,local_478._8_4_,uVar13);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
    if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
      operator_delete((void *)local_478._0_8_);
    }
LAB_001ed935:
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    goto LAB_001ed93d;
  default:
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_478._0_8_ = local_478 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_478,"Invalid constant expression basetype.","");
    ::std::runtime_error::runtime_error(prVar9,(string *)local_478);
    *(undefined ***)prVar9 = &PTR__runtime_error_003d7e38;
    __cxa_throw(prVar9,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  case 0xc:
    if ((bVar18 == 0) && (bVar14 == 0)) {
      uVar15 = (c->m).c[0].vecsize;
      uVar13 = (ulong)uVar15;
      if (uVar15 != 0) {
        uVar20 = 0;
        do {
          if (((uint)uVar13 < 2) || (uVar3 = (c->m).c[vector].id[uVar20].id, uVar3 == 0)) {
            convert_half_to_string_abi_cxx11_((string *)local_478,this,c,vector,(uint32_t)uVar20);
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
          }
          else {
            to_expression_abi_cxx11_((string *)local_478,this,uVar3,true);
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
          }
          if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
            operator_delete((void *)local_478._0_8_);
          }
          uVar20 = uVar20 + 1;
          if (uVar20 < (c->m).c[0].vecsize) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          uVar13 = (ulong)(c->m).c[0].vecsize;
        } while (uVar20 < uVar13);
      }
      goto LAB_001ed93d;
    }
    convert_half_to_string_abi_cxx11_((string *)local_478,this,c,vector,0);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
    if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
      operator_delete((void *)local_478._0_8_);
    }
    if (bVar14 == 0) goto LAB_001ed93d;
    pSVar7 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        *(uint *)&(c->super_IVariant).field_0xc);
    remap_swizzle((string *)local_478,this,pSVar7,1,__return_storage_ptr__);
    goto LAB_001ec2be;
  case 0xd:
    if ((bVar18 == 0) && (bVar14 == 0)) {
      uVar15 = (c->m).c[0].vecsize;
      uVar13 = (ulong)uVar15;
      if (uVar15 != 0) {
        uVar20 = 0;
        do {
          if (((uint)uVar13 < 2) || (uVar3 = (c->m).c[vector].id[uVar20].id, uVar3 == 0)) {
            convert_float_to_string_abi_cxx11_((string *)local_478,this,c,vector,(uint32_t)uVar20);
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
          }
          else {
            to_expression_abi_cxx11_((string *)local_478,this,uVar3,true);
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
          }
          if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
            operator_delete((void *)local_478._0_8_);
          }
          uVar20 = uVar20 + 1;
          if (uVar20 < (c->m).c[0].vecsize) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          uVar13 = (ulong)(c->m).c[0].vecsize;
        } while (uVar20 < uVar13);
      }
      goto LAB_001ed93d;
    }
    convert_float_to_string_abi_cxx11_((string *)local_478,this,c,vector,0);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
    if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
      operator_delete((void *)local_478._0_8_);
    }
    if (bVar14 == 0) goto LAB_001ed93d;
    pSVar7 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        *(uint *)&(c->super_IVariant).field_0xc);
    remap_swizzle((string *)local_478,this,pSVar7,1,__return_storage_ptr__);
    goto LAB_001ec2be;
  case 0xe:
    if ((bVar18 == 0) && (bVar14 == 0)) {
      uVar15 = (c->m).c[0].vecsize;
      uVar13 = (ulong)uVar15;
      if (uVar15 != 0) {
        uVar20 = 0;
        do {
          if (((uint)uVar13 < 2) || (uVar3 = (c->m).c[vector].id[uVar20].id, uVar3 == 0)) {
            convert_double_to_string_abi_cxx11_((string *)local_478,this,c,vector,(uint32_t)uVar20);
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
          }
          else {
            to_expression_abi_cxx11_((string *)local_478,this,uVar3,true);
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
          }
          if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
            operator_delete((void *)local_478._0_8_);
          }
          uVar20 = uVar20 + 1;
          if (uVar20 < (c->m).c[0].vecsize) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          uVar13 = (ulong)(c->m).c[0].vecsize;
        } while (uVar20 < uVar13);
      }
      goto LAB_001ed93d;
    }
    convert_double_to_string_abi_cxx11_((string *)local_478,this,c,vector,0);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_478._0_8_);
    if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
      operator_delete((void *)local_478._0_8_);
    }
    if (bVar14 == 0) goto LAB_001ed93d;
    pSVar7 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        *(uint *)&(c->super_IVariant).field_0xc);
    remap_swizzle((string *)local_478,this,pSVar7,1,__return_storage_ptr__);
LAB_001ec2be:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_478);
LAB_001ec518:
    if ((undefined1 *)local_478._0_8_ == local_478 + 0x10) goto LAB_001ed93d;
  }
  operator_delete((void *)local_478._0_8_);
LAB_001ed93d:
  if ((1 < (pSVar22->m).c[0].vecsize) && (bVar14 == 0)) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  local_2d0._0_8_ = &PTR__SPIRType_003d8230;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_1b8);
  local_208 = 0;
  if (local_210 != local_1f8) {
    free(local_210);
  }
  local_2d0._144_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_2d0._136_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_2d0 + 0xa0)) {
    free((void *)local_2d0._136_8_);
  }
  local_2d0._96_8_ = 0;
  if ((undefined1 *)local_2d0._88_8_ != local_2d0 + 0x70) {
    free((void *)local_2d0._88_8_);
  }
  local_2d0._40_8_ = 0;
  if ((undefined1 *)local_2d0._32_8_ != local_2d0 + 0x38) {
    free((void *)local_2d0._32_8_);
  }
  local_180._0_8_ = &PTR__SPIRType_003d8230;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  local_b8 = 0;
  if (local_c0 != local_a8) {
    free(local_c0);
  }
  local_180._144_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_180._136_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_180 + 0xa0)) {
    free((void *)local_180._136_8_);
  }
  local_180._96_8_ = 0;
  if ((undefined1 *)local_180._88_8_ != local_180 + 0x70) {
    free((void *)local_180._88_8_);
  }
  local_180._40_8_ = 0;
  if ((undefined1 *)local_180._32_8_ != local_180 + 0x38) {
    free((void *)local_180._32_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::constant_expression_vector(const SPIRConstant &c, uint32_t vector)
{
	auto type = get<SPIRType>(c.constant_type);
	type.columns = 1;

	auto scalar_type = type;
	scalar_type.vecsize = 1;

	string res;
	bool splat = backend.use_constructor_splatting && c.vector_size() > 1;
	bool swizzle_splat = backend.can_swizzle_scalar && c.vector_size() > 1;

	if (!type_is_floating_point(type))
	{
		// Cannot swizzle literal integers as a special case.
		swizzle_splat = false;
	}

	if (splat || swizzle_splat)
	{
		// Cannot use constant splatting if we have specialization constants somewhere in the vector.
		for (uint32_t i = 0; i < c.vector_size(); i++)
		{
			if (c.specialization_constant_id(vector, i) != 0)
			{
				splat = false;
				swizzle_splat = false;
				break;
			}
		}
	}

	if (splat || swizzle_splat)
	{
		if (type.width == 64)
		{
			uint64_t ident = c.scalar_u64(vector, 0);
			for (uint32_t i = 1; i < c.vector_size(); i++)
			{
				if (ident != c.scalar_u64(vector, i))
				{
					splat = false;
					swizzle_splat = false;
					break;
				}
			}
		}
		else
		{
			uint32_t ident = c.scalar(vector, 0);
			for (uint32_t i = 1; i < c.vector_size(); i++)
			{
				if (ident != c.scalar(vector, i))
				{
					splat = false;
					swizzle_splat = false;
				}
			}
		}
	}

	if (c.vector_size() > 1 && !swizzle_splat)
		res += type_to_glsl(type) + "(";

	switch (type.basetype)
	{
	case SPIRType::Half:
		if (splat || swizzle_splat)
		{
			res += convert_half_to_string(c, vector, 0);
			if (swizzle_splat)
				res = remap_swizzle(get<SPIRType>(c.constant_type), 1, res);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_half_to_string(c, vector, i);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Float:
		if (splat || swizzle_splat)
		{
			res += convert_float_to_string(c, vector, 0);
			if (swizzle_splat)
				res = remap_swizzle(get<SPIRType>(c.constant_type), 1, res);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_float_to_string(c, vector, i);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Double:
		if (splat || swizzle_splat)
		{
			res += convert_double_to_string(c, vector, 0);
			if (swizzle_splat)
				res = remap_swizzle(get<SPIRType>(c.constant_type), 1, res);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_double_to_string(c, vector, i);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Int64:
	{
		auto tmp = type;
		tmp.vecsize = 1;
		tmp.columns = 1;
		auto int64_type = type_to_glsl(tmp);

		if (splat)
		{
			res += convert_to_string(c.scalar_i64(vector, 0), int64_type, backend.long_long_literal_suffix);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_to_string(c.scalar_i64(vector, i), int64_type, backend.long_long_literal_suffix);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;
	}

	case SPIRType::UInt64:
		if (splat)
		{
			res += convert_to_string(c.scalar_u64(vector, 0));
			if (backend.long_long_literal_suffix)
				res += "ull";
			else
				res += "ul";
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += convert_to_string(c.scalar_u64(vector, i));
					if (backend.long_long_literal_suffix)
						res += "ull";
					else
						res += "ul";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::UInt:
		if (splat)
		{
			res += convert_to_string(c.scalar(vector, 0));
			if (is_legacy())
			{
				// Fake unsigned constant literals with signed ones if possible.
				// Things like array sizes, etc, tend to be unsigned even though they could just as easily be signed.
				if (c.scalar_i32(vector, 0) < 0)
					SPIRV_CROSS_THROW("Tried to convert uint literal into int, but this made the literal negative.");
			}
			else if (backend.uint32_t_literal_suffix)
				res += "u";
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += convert_to_string(c.scalar(vector, i));
					if (is_legacy())
					{
						// Fake unsigned constant literals with signed ones if possible.
						// Things like array sizes, etc, tend to be unsigned even though they could just as easily be signed.
						if (c.scalar_i32(vector, i) < 0)
							SPIRV_CROSS_THROW("Tried to convert uint literal into int, but this made "
							                  "the literal negative.");
					}
					else if (backend.uint32_t_literal_suffix)
						res += "u";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Int:
		if (splat)
			res += convert_to_string(c.scalar_i32(vector, 0));
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_to_string(c.scalar_i32(vector, i));
				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::UShort:
		if (splat)
		{
			res += convert_to_string(c.scalar(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					if (*backend.uint16_t_literal_suffix)
					{
						res += convert_to_string(c.scalar_u16(vector, i));
						res += backend.uint16_t_literal_suffix;
					}
					else
					{
						// If backend doesn't have a literal suffix, we need to value cast.
						res += type_to_glsl(scalar_type);
						res += "(";
						res += convert_to_string(c.scalar_u16(vector, i));
						res += ")";
					}
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Short:
		if (splat)
		{
			res += convert_to_string(c.scalar_i16(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					if (*backend.int16_t_literal_suffix)
					{
						res += convert_to_string(c.scalar_i16(vector, i));
						res += backend.int16_t_literal_suffix;
					}
					else
					{
						// If backend doesn't have a literal suffix, we need to value cast.
						res += type_to_glsl(scalar_type);
						res += "(";
						res += convert_to_string(c.scalar_i16(vector, i));
						res += ")";
					}
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::UByte:
		if (splat)
		{
			res += convert_to_string(c.scalar_u8(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += type_to_glsl(scalar_type);
					res += "(";
					res += convert_to_string(c.scalar_u8(vector, i));
					res += ")";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::SByte:
		if (splat)
		{
			res += convert_to_string(c.scalar_i8(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += type_to_glsl(scalar_type);
					res += "(";
					res += convert_to_string(c.scalar_i8(vector, i));
					res += ")";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Boolean:
		if (splat)
			res += c.scalar(vector, 0) ? "true" : "false";
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += c.scalar(vector, i) ? "true" : "false";

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	default:
		SPIRV_CROSS_THROW("Invalid constant expression basetype.");
	}

	if (c.vector_size() > 1 && !swizzle_splat)
		res += ")";

	return res;
}